

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O3

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Port::assign_(Port *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  int iVar2;
  StmtException *this_00;
  UserException *this_01;
  undefined4 in_register_00000014;
  long *plVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar4;
  shared_ptr<kratos::AssignStmt> sVar5;
  initializer_list<kratos::IRNode_*> __l;
  string_view format_str;
  format_args args;
  IRNode *local_d0;
  long local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0 [4];
  pointer local_a0;
  element_type *peStack_98;
  string local_80;
  IRNode *local_60;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::VarCasted> casted;
  allocator_type local_31;
  
  plVar3 = (long *)CONCAT44(in_register_00000014,type);
  if (*plVar3 == 0) {
    this_01 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_80,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58,
                   "Trying to assign null to ",&local_80);
    UserException::UserException(this_01,(string *)auStack_58);
    __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)(*plVar3 + 0x168);
  if (iVar1 - 3U < 2) goto LAB_001e4933;
  iVar2 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
  bVar4 = iVar2 == 0;
  if (iVar1 != 6) {
    if (iVar2 == 0) goto LAB_001e4933;
    goto LAB_001e49a2;
  }
  local_60 = (IRNode *)var;
  Var::as<kratos::VarCasted>((Var *)auStack_58);
  switch(*(undefined4 *)((long)auStack_58 + 0x280)) {
  case 2:
    bVar4 = *(int *)((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_60[6]._vptr_IRNode)->_M_ptr + 4) == 1;
    break;
  case 3:
    bVar4 = *(int *)((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_60[6]._vptr_IRNode)->_M_ptr + 4) == 2;
    break;
  case 4:
    bVar4 = *(int *)((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_60[6]._vptr_IRNode)->_M_ptr + 4) == 4;
    break;
  case 5:
    bVar4 = *(int *)((long)&((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                            &local_60[6]._vptr_IRNode)->_M_ptr + 4) == 3;
    break;
  default:
    goto switchD_001e491d_default;
  }
  bVar4 = (bool)(bVar4 | iVar2 == 0);
switchD_001e491d_default:
  if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  var = (shared_ptr<kratos::Var> *)local_60;
  if (!bVar4) {
LAB_001e49a2:
    this_00 = (StmtException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)*plVar3 + 0xf8))(&local_a0);
    (*(code *)(((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &((IRNode *)var)->_vptr_IRNode)->_M_ptr->sinks_)._M_h._M_buckets)(local_c0,var);
    auStack_58 = (undefined1  [8])local_a0;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_c0[0];
    format_str.size_ = 0xdd;
    format_str.data_ = (char *)0x38;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_58;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_80,(detail *)"Typing error. Cannot assign variable ({0}) to port ({1})",
               format_str,args);
    local_c8 = *plVar3;
    __l._M_len = 2;
    __l._M_array = &local_d0;
    local_d0 = (IRNode *)var;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58,__l,
               &local_31);
    StmtException::StmtException
              (this_00,&local_80,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_58);
    __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001e4933:
  sVar5 = Var::assign_(&this->super_Var,var,type);
  sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Port::assign_(const std::shared_ptr<Var>& var,
                                          enum kratos::AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // notice that we have the following rules
    // var <- port. this is considered as a lower cast, hence it's allowed
    // port <- var. this is considered as an upper cast, which needs explicit casting
    if (var->type() != VarType::PortIO && var->type() != VarType::ConstValue) {
        bool allowed = port_type() == PortType::Data;
        if (var->type() == VarType::BaseCasted) {
            auto casted = var->as<VarCasted>();
            auto cast_type = casted->cast_type();
            if (cast_type == VarCastType::AsyncReset && port_type() == PortType::AsyncReset)
                allowed = true;  // NOLINT
            if (cast_type == VarCastType::Reset && port_type() == PortType::Reset)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::Clock && port_type() == PortType::Clock)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::ClockEnable && port_type() == PortType::ClockEnable)
                allowed = true;  // NOLINT
        }
        if (!allowed) {
            throw StmtException(::format("Typing error. Cannot assign variable ({0}) to port ({1})",
                                         var->to_string(), to_string()),
                                {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}